

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumlib.hpp
# Opt level: O0

double __thiscall sumlib::rsorted<double>::get(rsorted<double> *this)

{
  iterator iVar1;
  iterator iVar2;
  double dVar3;
  rsorted<double> *this_local;
  
  iVar1 = std::begin<std::vector<double,std::allocator<double>>>(&this->xs);
  iVar2 = std::end<std::vector<double,std::allocator<double>>>(&this->xs);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar1._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar2._M_current);
  iVar1 = std::begin<std::vector<double,std::allocator<double>>>(&this->xs);
  iVar2 = std::end<std::vector<double,std::allocator<double>>>(&this->xs);
  std::reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar1._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar2._M_current);
  iVar1 = std::begin<std::vector<double,std::allocator<double>>>(&this->xs);
  iVar2 = std::end<std::vector<double,std::allocator<double>>>(&this->xs);
  dVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar1._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar2._M_current,0.0);
  return dVar3;
}

Assistant:

T get() {
            std::sort( begin(xs), end(xs) );
            std::reverse( begin(xs), end(xs) );
            return accumulate(begin(xs), end(xs), (T)0);
        }